

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O0

int getboolattrib(rnndb *db,char *file,int line,xmlAttr *attr)

{
  int iVar1;
  char *__s1;
  char *c;
  xmlAttr *attr_local;
  int line_local;
  char *file_local;
  rnndb *db_local;
  
  __s1 = getattrib(db,file,line,attr);
  iVar1 = strcmp(__s1,"yes");
  if ((iVar1 == 0) || (iVar1 = strcmp(__s1,"1"), iVar1 == 0)) {
    return 1;
  }
  iVar1 = strcmp(__s1,"no");
  if ((iVar1 != 0) && (iVar1 = strcmp(__s1,"0"), iVar1 != 0)) {
    fprintf(_stderr,"%s:%d: invalid boolean value \"%s\" in attribute \"%s\"\n",file,
            (ulong)(uint)line,__s1,attr->name);
    db->estatus = 1;
    return 0;
  }
  return 0;
}

Assistant:

static int getboolattrib (struct rnndb *db, char *file, int line, xmlAttr *attr) {
	char *c = getattrib(db, file, line, attr);
	if (!strcmp(c, "yes") || !strcmp(c, "1"))
		return 1;
	if (!strcmp(c, "no") || !strcmp(c, "0"))
		return 0;
	fprintf (stderr, "%s:%d: invalid boolean value \"%s\" in attribute \"%s\"\n", file, line, c, attr->name);
	db->estatus = 1;
	return 0;
}